

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O0

void __thiscall cubeb_context_variables_Test::TestBody(cubeb_context_variables_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  cubeb_stream_params params;
  uint32_t value;
  cubeb *ctx;
  int r;
  cubeb *in_stack_fffffffffffffe48;
  undefined6 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe56;
  undefined1 uVar2;
  undefined1 in_stack_fffffffffffffe57;
  undefined1 uVar3;
  cubeb **in_stack_fffffffffffffe58;
  cubeb **in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  char *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  Type in_stack_fffffffffffffe7c;
  cubeb_stream_params *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  AssertionResult local_170;
  string local_160 [16];
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  AssertionResult *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  undefined1 uVar4;
  AssertionResult local_128;
  string local_118 [55];
  undefined1 local_e1;
  AssertionResult local_e0;
  string local_d0 [55];
  undefined1 local_99;
  AssertionResult local_98 [2];
  undefined8 local_78;
  AssertionResult local_70;
  uint local_5c;
  undefined4 local_44;
  AssertionResult local_40;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  int local_1c;
  int local_c;
  
  local_c = common_init(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
  local_44 = 0;
  testing::internal::EqHelper::
  Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_mozilla[P]cubeb_include_cubeb_cubeb_h:300:1),_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (char *)in_stack_fffffffffffffe60,(int *)in_stack_fffffffffffffe58,
             (anon_enum_32 *)
             CONCAT17(in_stack_fffffffffffffe57,
                      CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe80);
    testing::AssertionResult::failure_message((AssertionResult *)0x10df9f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
               in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,(char *)in_stack_fffffffffffffe60
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (Message *)in_stack_fffffffffffffec8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffffe57,
                        CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)));
    testing::Message::~Message((Message *)0x10dfef);
  }
  local_5c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e014);
  if (local_5c == 0) {
    local_78 = 0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
               (char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (void **)CONCAT17(in_stack_fffffffffffffe57,
                                 CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe80);
      testing::AssertionResult::failure_message((AssertionResult *)0x10e08c);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                 in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                 (char *)in_stack_fffffffffffffe60);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                 (Message *)in_stack_fffffffffffffec8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 CONCAT17(in_stack_fffffffffffffe57,
                          CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)));
      testing::Message::~Message((Message *)0x10e0dc);
    }
    local_5c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e101);
    if (local_5c == 0) {
      local_28 = 1;
      local_30 = 0;
      local_2c = 0xac44;
      local_24 = 4;
      local_20 = 0;
      local_c = cubeb_get_min_latency
                          ((cubeb *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                           in_stack_fffffffffffffe80,
                           (uint32_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                          );
      uVar3 = local_c == 0 || local_c == -4;
      local_99 = uVar3;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)
                 CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)),
                 (bool *)in_stack_fffffffffffffe48,(type *)0x10e1b3);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_98);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe80);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                   in_stack_fffffffffffffeb0);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                   in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                   (char *)in_stack_fffffffffffffe60);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                   (Message *)in_stack_fffffffffffffec8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)
                   CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)));
        std::__cxx11::string::~string(local_d0);
        testing::Message::~Message((Message *)0x10e26c);
      }
      local_5c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e291);
      if (local_5c == 0) {
        if (local_c == 0) {
          local_e1 = local_1c != 0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)
                     CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)),
                     (bool *)in_stack_fffffffffffffe48,(type *)0x10e2de);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8
                       ,in_stack_fffffffffffffeb0);
            std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                       in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                       (char *)in_stack_fffffffffffffe60);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0)
                       ,(Message *)in_stack_fffffffffffffec8);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)
                       CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50))
                      );
            std::__cxx11::string::~string(local_118);
            testing::Message::~Message((Message *)0x10e397);
          }
          local_5c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e3bc);
          if (local_5c != 0) {
            return;
          }
        }
        local_c = cubeb_get_preferred_sample_rate(in_stack_fffffffffffffe48,(uint32_t *)0x10e3e5);
        uVar2 = local_c == 0 || local_c == -4;
        uVar4 = uVar2;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_fffffffffffffe50)),
                   (bool *)in_stack_fffffffffffffe48,(type *)0x10e431);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe80);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                     in_stack_fffffffffffffeb0);
          std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                     in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                     (char *)in_stack_fffffffffffffe60);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffed0),
                     (Message *)in_stack_fffffffffffffec8);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_fffffffffffffe50)));
          std::__cxx11::string::~string(local_160);
          testing::Message::~Message((Message *)0x10e4d8);
        }
        local_5c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e4fd);
        if (local_5c == 0) {
          if (local_c == 0) {
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_fffffffffffffe50)),
                       (bool *)in_stack_fffffffffffffe48,(type *)0x10e541);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_170);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffe80);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
              std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                         in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                         (char *)in_stack_fffffffffffffe60);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffed0),
                         (Message *)in_stack_fffffffffffffec8);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_fffffffffffffe50)));
              std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
              testing::Message::~Message((Message *)0x10e5d9);
            }
            local_5c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e5fb);
            if (local_5c != 0) {
              return;
            }
          }
          cubeb_destroy((cubeb *)0x10e619);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(cubeb, context_variables)
{
  int r;
  cubeb * ctx;
  uint32_t value;
  cubeb_stream_params params;

  r = common_init(&ctx, "test_context_variables");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  params.channels = STREAM_CHANNELS;
  params.format = STREAM_FORMAT;
  params.rate = STREAM_RATE;
  params.layout = STREAM_LAYOUT;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_get_min_latency(ctx, &params, &value);
  ASSERT_TRUE(r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED);
  if (r == CUBEB_OK) {
    ASSERT_TRUE(value > 0);
  }

  r = cubeb_get_preferred_sample_rate(ctx, &value);
  ASSERT_TRUE(r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED);
  if (r == CUBEB_OK) {
    ASSERT_TRUE(value > 0);
  }

  cubeb_destroy(ctx);
}